

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiling_info-c.cpp
# Opt level: O2

duckdb_profiling_info duckdb_profiling_info_get_child(duckdb_profiling_info info,idx_t index)

{
  optional_ptr<duckdb::ProfilingNode,_true> oVar1;
  
  if ((info != (duckdb_profiling_info)0x0) &&
     (index < (ulong)(*(long *)(info + 0x110) - *(long *)(info + 0x108) >> 3))) {
    oVar1 = duckdb::ProfilingNode::GetChild((ProfilingNode *)info,index);
    return (duckdb_profiling_info)oVar1.ptr;
  }
  return (duckdb_profiling_info)0x0;
}

Assistant:

duckdb_profiling_info duckdb_profiling_info_get_child(duckdb_profiling_info info, idx_t index) {
	if (!info) {
		return nullptr;
	}
	auto &node = *reinterpret_cast<duckdb::ProfilingNode *>(info);
	if (index >= node.GetChildCount()) {
		return nullptr;
	}

	ProfilingNode *profiling_info_ptr = node.GetChild(index).get();
	return reinterpret_cast<duckdb_profiling_info>(profiling_info_ptr);
}